

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-pickup.c
# Opt level: O3

void player_pickup_aux(player *p,object *obj,wchar_t auto_max,_Bool domsg)

{
  uint32_t *puVar1;
  loc grid;
  loc grid_00;
  wchar_t max;
  wchar_t wVar2;
  object *obj_00;
  _Bool dummy;
  _Bool local_21;
  
  max = inven_carry_num(p,obj);
  if (max == L'\0') {
    quit_fmt("Failed pickup of %s",obj->kind->name);
  }
  puVar1 = &p->upkeep->notice;
  *puVar1 = *puVar1 | 2;
  wVar2 = auto_max;
  if (max < auto_max) {
    wVar2 = max;
  }
  if (auto_max == L'\0') {
    wVar2 = max;
  }
  if (wVar2 != (uint)obj->number) {
    if ((auto_max == L'\0') && (auto_max = get_quantity((char *)0x0,max), auto_max == L'\0')) {
      return;
    }
    obj_00 = floor_object_for_use(p,obj,auto_max,false,&local_21);
    inven_carry(p,obj_00,true,true);
    return;
  }
  if (obj->known != (object *)0x0) {
    grid.x = (p->grid).x;
    grid.y = (p->grid).y;
    square_excise_object((chunk_conflict *)p->cave,grid,obj->known);
    delist_object((chunk_conflict *)p->cave,obj->known);
  }
  grid_00.x = (p->grid).x;
  grid_00.y = (p->grid).y;
  square_excise_object(cave,grid_00,obj);
  delist_object(cave,obj);
  inven_carry(p,obj,true,true);
  return;
}

Assistant:

static void player_pickup_aux(struct player *p, struct object *obj,
							  int auto_max, bool domsg)
{
	int max = inven_carry_num(p, obj);

	/* Confirm at least some of the object can be picked up */
	if (max == 0)
		quit_fmt("Failed pickup of %s", obj->kind->name);

	/* Set ignore status */
	p->upkeep->notice |= PN_IGNORE;

	/* Allow auto-pickup to limit the number if it wants to */
	if (auto_max && max > auto_max) {
		max = auto_max;
	}

	/* Carry the object, prompting for number if necessary */
	if (max == obj->number) {
		if (obj->known) {
			square_excise_object(p->cave, p->grid, obj->known);
			delist_object(p->cave, obj->known);
		}
		square_excise_object(cave, p->grid, obj);
		delist_object(cave, obj);
		inven_carry(p, obj, true, domsg);
	} else {
		int num;
		bool dummy;
		struct object *picked_up;

		if (auto_max)
			num = auto_max;
		else
			num = get_quantity(NULL, max);
		if (!num) return;
		picked_up = floor_object_for_use(p, obj, num, false, &dummy);
		inven_carry(p, picked_up, true, domsg);
	}
}